

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_implicit
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  LayoutBindingProgram *pLVar5;
  ulong uVar6;
  reference pvVar7;
  mapped_type_conflict *pmVar8;
  char *pcVar9;
  bool passed_00;
  String local_6f0;
  int *local_6d0;
  allocator<char> local_6c1;
  String local_6c0;
  String local_6a0;
  int local_67c;
  undefined1 local_678 [4];
  int idx_2;
  undefined1 local_660 [8];
  StringIntMap bindingPoints;
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string *local_5b0;
  String *u;
  undefined1 local_588 [8];
  ostringstream texUnitStr;
  undefined1 local_408 [4];
  int idx_1;
  StringVector list;
  String local_3e8;
  LayoutBindingProgramAutoPtr local_3c8;
  LayoutBindingProgramAutoPtr program;
  string local_3a0 [32];
  string local_380 [36];
  uint local_35c;
  undefined1 local_358 [4];
  int idx;
  StringStream s;
  String local_1c0;
  allocator<char> local_199;
  string local_198 [32];
  string local_178 [32];
  String local_158;
  string local_138 [32];
  String local_118;
  allocator<char> local_f1;
  String local_f0;
  String local_d0;
  allocator<char> local_a9;
  String local_a8;
  undefined1 local_88 [8];
  String decl;
  int local_54;
  uint local_50;
  uint local_4c;
  int arraySize;
  int baseBindingPoint;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  iterator it;
  vector<int,_std::allocator<int>_> bindings;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  passed_00 = true;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
  makeSparseRange((vector<int,_std::allocator<int>_> *)&it,this,iVar2,0);
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&it);
  while( true ) {
    _arraySize = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&it);
    bVar1 = __gnu_cxx::operator<
                      (&local_40,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &arraySize);
    if (!bVar1) break;
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_40);
    local_4c = *puVar3;
    local_54 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
    local_54 = local_54 - local_4c;
    decl.field_2._8_4_ = 4;
    puVar3 = (uint *)std::min<int>(&local_54,(int *)(decl.field_2._M_local_buf + 8));
    local_50 = *puVar3;
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar9 = *(char **)CONCAT44(extraout_var,iVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar9,&local_a9);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&local_d0,this,(ulong)local_4c);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar9 = *(char **)(CONCAT44(extraout_var_00,iVar2) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar9,&local_f1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_138,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_118,this,local_138);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_178,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_198,"float",&local_199);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_158,this,local_178,local_198);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1c0,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
              (&s.super_ostringstream.field_0x170,this,(ulong)local_50);
    buildUniformDecl((String *)local_88,this,&local_a8,&local_d0,&local_f0,&local_118,&local_158,
                     &local_1c0,(String *)&s.super_ostringstream.field_0x170);
    std::__cxx11::string::~string((string *)&s.super_ostringstream.field_0x170);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    setTemplateParam(this,"UNIFORM_DECL",(String *)local_88);
    StringStream::StringStream((StringStream *)local_358);
    for (local_35c = 0; (int)local_35c < (int)local_50; local_35c = local_35c + 1) {
      pcVar9 = "";
      if (local_35c != 0) {
        pcVar9 = " + ";
      }
      poVar4 = std::operator<<((ostream *)local_358,pcVar9);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                (local_3a0,this,0,(ulong)local_35c);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                (local_380,this,local_3a0);
      std::operator<<(poVar4,local_380);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_3a0);
    }
    std::operator<<((ostream *)local_358,";\n");
    std::__cxx11::ostringstream::str();
    setTemplateParam(this,"UNIFORM_ACCESS",(String *)&program);
    std::__cxx11::string::~string((string *)&program);
    updateTemplate(this);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_3c8,&this->super_IProgramContextSupplier);
    pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3c8);
    bVar1 = LayoutBindingProgram::compiledAndLinked(pLVar5);
    passed_00 = (passed_00 & bVar1) != 0;
    if (passed_00) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_408);
      for (texUnitStr._372_4_ = 0; (int)texUnitStr._372_4_ < (int)local_50;
          texUnitStr._372_4_ = texUnitStr._372_4_ + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&u,this,0);
        std::operator<<((ostream *)local_588,(string *)&u);
        std::__cxx11::string::~string((string *)&u);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (local_5f0,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (local_5d0,this,local_5f0);
        std::__cxx11::string::~string(local_5f0);
        local_5b0 = local_5d0;
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::operator<<((ostream *)local_588,"_block");
        }
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                  (local_610,this,(ulong)(uint)texUnitStr._372_4_);
        std::operator<<((ostream *)local_588,local_610);
        std::__cxx11::string::~string(local_610);
        std::__cxx11::ostringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_408,
                    (value_type *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string
                  ((string *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string(local_5d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
      }
      pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_678,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_408);
      (*pLVar5->_vptr_LayoutBindingProgram[3])(local_660,pLVar5,local_678);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_678);
      for (local_67c = 0; local_67c < (int)local_50; local_67c = local_67c + 1) {
        iVar2 = local_4c + local_67c;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_408,(long)local_67c);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_660,pvVar7);
        passed_00 = (bool)(passed_00 & iVar2 == *pmVar8);
        if (!passed_00) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6c0,"binding point did not match default",&local_6c1);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_408,(long)local_67c);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)local_660,pvVar7);
          generateLog<int,int>(&local_6a0,this,&local_6c0,*pmVar8,local_4c + local_67c);
          LayoutBindingTestResult::LayoutBindingTestResult
                    (__return_storage_ptr__,passed_00,&local_6a0,false);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::allocator<char>::~allocator(&local_6c1);
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          goto LAB_013aa051;
        }
      }
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_013aa051:
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_660);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_408);
    }
    else {
      pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3c8);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_3e8,pLVar5,false);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,passed_00,&local_3e8,false);
      std::__cxx11::string::~string((string *)&local_3e8);
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_3c8);
    StringStream::~StringStream((StringStream *)local_358);
    std::__cxx11::string::~string((string *)local_88);
    if (list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_013aa160;
    local_6d0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator++(&local_40,0);
  }
  std::__cxx11::string::string((string *)&local_6f0);
  LayoutBindingTestResult::LayoutBindingTestResult
            (__return_storage_ptr__,passed_00,&local_6f0,false);
  std::__cxx11::string::~string((string *)&local_6f0);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_013aa160:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_implicit(void)
{
	bool passed = true;

	std::vector<int> bindings = makeSparseRange(maxBindings(), 0);
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int baseBindingPoint = *it;
		int arraySize		 = std::min(maxBindings() - baseBindingPoint, 4);

		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(baseBindingPoint),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}
		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= ((baseBindingPoint + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]], (baseBindingPoint + idx)));
			}
		}
	}
	return LayoutBindingTestResult(passed, String());
}